

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall Computed_Colors_Record_Data::Print(Computed_Colors_Record_Data *this,ostream *os)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  poVar1 = std::ostream::_M_insert<void_const*>(os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  print_color(os," fore",&this->foreground_style);
  print_color(os," back",&this->background_style);
  print_color(os," shad",&this->shadow_style);
  print_color(os," high",&this->highlight_style);
  print_color(os," high2",&this->highlight2_style);
  std::__ostream_insert<char,std::char_traits<char>>(os," light=",7);
  std::ostream::_M_insert<bool>(SUB81(os,0));
  return;
}

Assistant:

void
Computed_Colors_Record_Data::Print(std::ostream &os) const
{
  os << "[" << (void *)this << "]";
  print_color(os, " fore", foreground_style);
  print_color(os, " back", background_style);
  print_color(os, " shad", shadow_style);
  print_color(os, " high", highlight_style);
  print_color(os, " high2", highlight2_style);
  os << " light=" << light;
}